

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_miniz.h
# Opt level: O2

tinfl_status
buminiz::tinfl_decompress
          (tinfl_decompressor *r,mz_uint8 *pIn_buf_next,size_t *pIn_buf_size,
          mz_uint8 *pOut_buf_start,mz_uint8 *pOut_buf_next,size_t *pOut_buf_size,
          mz_uint32 decomp_flags)

{
  uint *puVar1;
  ushort uVar2;
  short sVar3;
  bool bVar4;
  bool bVar5;
  tinfl_huff_table *ptVar6;
  tinfl_status tVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined1 *puVar12;
  mz_uint8 *pmVar13;
  mz_uint8 *pmVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  mz_uint8 *pmVar18;
  ulong uVar19;
  mz_uint8 *pmVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  uint uVar26;
  int iVar27;
  mz_uint mVar28;
  uint uVar29;
  size_t sVar30;
  uint uVar31;
  long lVar32;
  ulong uVar33;
  mz_int16 *__s;
  ulong uVar34;
  ulong uVar35;
  mz_uint8 *pmVar36;
  mz_uint8 *pmVar37;
  bool bVar38;
  ulong uStack_150;
  uint local_13c;
  size_t local_138;
  uint *local_128;
  ulong local_120;
  ulong local_118;
  tinfl_status local_fc;
  mz_uint total_syms [16];
  mz_uint next_code [17];
  
  if (pOut_buf_next < pOut_buf_start) {
LAB_0011b66d:
    *pOut_buf_size = 0;
    *pIn_buf_size = 0;
    return TINFL_STATUS_BAD_PARAM;
  }
  pmVar18 = pOut_buf_next + *pOut_buf_size;
  uVar35 = -(ulong)((decomp_flags & 4) != 0) | (ulong)(pmVar18 + ~(ulong)pOut_buf_start);
  if ((uVar35 + 1 & uVar35) != 0) goto LAB_0011b66d;
  tVar7 = r->m_state;
  uVar17 = r->m_num_bits;
  local_118 = r->m_bit_buf;
  uVar26 = r->m_dist;
  local_120 = (ulong)uVar26;
  uVar16 = r->m_counter;
  uVar34 = (ulong)uVar16;
  local_13c = r->m_num_extra;
  local_138 = r->m_dist_from_out_buf_start;
  bVar38 = false;
  local_128 = (uint *)pIn_buf_next;
  pmVar37 = pOut_buf_next;
  local_120._0_4_ = uVar26;
  if (0x35 < (uint)tVar7) {
LAB_0011bb35:
    bVar4 = false;
    local_fc = TINFL_STATUS_FAILED;
    goto LAB_0011cd99;
  }
  sVar30 = *pIn_buf_size;
  puVar1 = (uint *)(pIn_buf_next + sVar30);
  local_fc = TINFL_STATUS_NEEDS_MORE_INPUT;
  uVar25 = uVar34;
  switch(tVar7) {
  case TINFL_STATUS_DONE:
    r->m_zhdr1 = 0;
    r->m_z_adler32 = 1;
    r->m_zhdr0 = 0;
    r->m_check_adler32 = 1;
    if ((decomp_flags & 1) != 0) {
      if ((long)sVar30 < 1) {
        local_118 = 0;
        local_13c = 0;
        uVar34 = 0;
        local_120 = 0;
        uVar17 = 0;
        goto LAB_0011bc1e;
      }
      local_128 = (uint *)(pIn_buf_next + 1);
      r->m_zhdr0 = (uint)*pIn_buf_next;
      local_118 = 0;
      local_13c = 0;
      uVar34 = 0;
      local_120 = 0;
      uVar17 = 0;
      goto LAB_0011bc38;
    }
    local_118 = 0;
    local_13c = 0;
    local_120 = 0;
    uVar17 = 0;
    goto LAB_0011bd30;
  case TINFL_STATUS_NEEDS_MORE_INPUT:
    if ((long)sVar30 < 1) {
LAB_0011bc1e:
      if ((decomp_flags & 2) != 0) {
        bVar4 = false;
        tVar7 = TINFL_STATUS_NEEDS_MORE_INPUT;
        local_fc = tVar7;
        bVar38 = true;
        break;
      }
      r->m_zhdr0 = 0;
    }
    else {
      r->m_zhdr0 = (uint)*pIn_buf_next;
      local_128 = (uint *)(pIn_buf_next + 1);
    }
LAB_0011bc38:
    if (local_128 < puVar1) goto LAB_0011b77f;
LAB_0011bc43:
    uVar26 = 0;
    if ((decomp_flags & 2) == 0) goto LAB_0011bc5d;
    tVar7 = TINFL_STATUS_HAS_MORE_OUTPUT;
    bVar38 = true;
LAB_0011bcfe:
    bVar4 = false;
    break;
  case TINFL_STATUS_HAS_MORE_OUTPUT:
    if ((long)sVar30 < 1) goto LAB_0011bc43;
LAB_0011b77f:
    uVar26 = (uint)(byte)*local_128;
    local_128 = (uint *)((long)local_128 + 1);
LAB_0011bc5d:
    uVar16 = r->m_zhdr0;
    bVar38 = (uVar16 & 0xf) != 8;
    bVar4 = (uVar26 & 0x20) != 0;
    bVar5 = (uVar16 << 8 | uVar26) % 0x1f != 0;
    r->m_zhdr1 = uVar26;
    tVar7 = 0x24;
    if ((decomp_flags & 4) == 0) {
      bVar15 = (byte)(uVar16 >> 4);
      if (((bVar38 || (bVar4 || bVar5)) || 0x8000 < (uint)(0x100 << (bVar15 & 0x1f))) ||
          uVar35 + 1 >> (bVar15 + 8 & 0x3f) == 0) {
        uVar34 = 1;
        bVar38 = false;
        local_fc = TINFL_STATUS_FAILED;
        goto LAB_0011bcfe;
      }
    }
    else if (bVar38 || (bVar4 || bVar5)) {
      uVar34 = 1;
      bVar38 = false;
      local_fc = TINFL_STATUS_FAILED;
      goto LAB_0011bcfe;
    }
LAB_0011bd30:
    uVar25 = 0;
    do {
      for (; uVar17 < 3; uVar17 = uVar17 + 8) {
        uVar34 = uVar25;
        if (local_128 < puVar1) {
LAB_0011b7ea:
          uVar25 = (ulong)(byte)*local_128;
          local_128 = (uint *)((long)local_128 + 1);
        }
        else {
LAB_0011c016:
          uVar25 = 0;
          if ((decomp_flags & 2) != 0) {
            tVar7 = TINFL_STATUS_HAS_MORE_OUTPUT|TINFL_STATUS_NEEDS_MORE_INPUT;
            uVar25 = uVar34;
            goto LAB_0011cd8f;
          }
        }
        local_118 = local_118 | uVar25 << ((byte)uVar17 & 0x3f);
        uVar25 = uVar34;
      }
      uVar16 = (uint)local_118 & 7;
      r->m_final = uVar16;
      uVar33 = local_118 >> 3;
      uVar17 = uVar17 - 3;
      uVar26 = uVar16 >> 1;
      r->m_type = uVar26;
      if (1 < uVar16) {
        local_118 = uVar33;
        if (uVar26 == 1) {
          r->m_table_sizes[0] = 0x120;
          r->m_table_sizes[1] = 0x20;
          r->m_tables[1].m_code_size[0] = '\x05';
          r->m_tables[1].m_code_size[1] = '\x05';
          r->m_tables[1].m_code_size[2] = '\x05';
          r->m_tables[1].m_code_size[3] = '\x05';
          r->m_tables[1].m_code_size[4] = '\x05';
          r->m_tables[1].m_code_size[5] = '\x05';
          r->m_tables[1].m_code_size[6] = '\x05';
          r->m_tables[1].m_code_size[7] = '\x05';
          ptVar6 = r->m_tables;
          ptVar6[1].m_code_size[8] = '\x05';
          ptVar6[1].m_code_size[9] = '\x05';
          ptVar6[1].m_code_size[10] = '\x05';
          ptVar6[1].m_code_size[0xb] = '\x05';
          ptVar6[1].m_code_size[0xc] = '\x05';
          ptVar6[1].m_code_size[0xd] = '\x05';
          ptVar6[1].m_code_size[0xe] = '\x05';
          ptVar6[1].m_code_size[0xf] = '\x05';
          ptVar6 = r->m_tables;
          ptVar6[1].m_code_size[0x10] = '\x05';
          ptVar6[1].m_code_size[0x11] = '\x05';
          ptVar6[1].m_code_size[0x12] = '\x05';
          ptVar6[1].m_code_size[0x13] = '\x05';
          ptVar6[1].m_code_size[0x14] = '\x05';
          ptVar6[1].m_code_size[0x15] = '\x05';
          ptVar6[1].m_code_size[0x16] = '\x05';
          ptVar6[1].m_code_size[0x17] = '\x05';
          ptVar6 = r->m_tables;
          ptVar6[1].m_code_size[0x18] = '\x05';
          ptVar6[1].m_code_size[0x19] = '\x05';
          ptVar6[1].m_code_size[0x1a] = '\x05';
          ptVar6[1].m_code_size[0x1b] = '\x05';
          ptVar6[1].m_code_size[0x1c] = '\x05';
          ptVar6[1].m_code_size[0x1d] = '\x05';
          ptVar6[1].m_code_size[0x1e] = '\x05';
          ptVar6[1].m_code_size[0x1f] = '\x05';
          for (lVar32 = 0x48; (int)lVar32 != 0xd8; lVar32 = lVar32 + 1) {
            *(undefined1 *)((long)r->m_table_sizes + lVar32 + -0x2c) = 8;
          }
          puVar12 = (undefined1 *)((long)r->m_table_sizes + lVar32 + -0x2c);
          for (iVar9 = 0x90; iVar9 != 0x100; iVar9 = iVar9 + 1) {
            *puVar12 = 9;
            puVar12 = puVar12 + 1;
          }
          for (lVar32 = 0; (int)lVar32 != 0x18; lVar32 = lVar32 + 1) {
            puVar12[lVar32] = 7;
          }
          for (lVar24 = 0; (int)lVar24 != 8; lVar24 = lVar24 + 1) {
            puVar12[lVar32 + lVar24] = 8;
          }
LAB_0011c2f5:
          uVar26 = r->m_type;
          uVar34 = uVar25;
          while (-1 < (int)uVar26) {
            total_syms[0xc] = 0;
            total_syms[0xd] = 0;
            total_syms[0xe] = 0;
            total_syms[0xf] = 0;
            total_syms[8] = 0;
            total_syms[9] = 0;
            total_syms[10] = 0;
            total_syms[0xb] = 0;
            total_syms[4] = 0;
            total_syms[5] = 0;
            total_syms[6] = 0;
            total_syms[7] = 0;
            total_syms[0] = 0;
            total_syms[1] = 0;
            total_syms[2] = 0;
            total_syms[3] = 0;
            __s = r->m_tables[uVar26].m_look_up;
            memset(__s,0,0xc80);
            uVar16 = r->m_table_sizes[uVar26];
            for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
              total_syms[r->m_tables[uVar26].m_code_size[uVar25]] =
                   total_syms[r->m_tables[uVar26].m_code_size[uVar25]] + 1;
            }
            next_code[0] = 0;
            next_code[1] = 0;
            uVar8 = 0;
            mVar28 = 0;
            for (lVar32 = 0; lVar32 != 0xf; lVar32 = lVar32 + 1) {
              uVar8 = uVar8 + total_syms[lVar32 + 1];
              mVar28 = (mVar28 + total_syms[lVar32 + 1]) * 2;
              next_code[lVar32 + 2] = mVar28;
            }
            if (mVar28 != 0x10000 && 1 < uVar8) {
              tVar7 = 0x23;
              bVar4 = false;
              local_fc = TINFL_STATUS_FAILED;
              bVar38 = false;
              goto LAB_0011cd92;
            }
            uVar8 = 0xffffffff;
            for (uVar25 = 0; uVar25 != uVar16; uVar25 = uVar25 + 1) {
              bVar15 = r->m_tables[uVar26].m_code_size[uVar25];
              uVar33 = (ulong)bVar15;
              if (bVar15 != 0) {
                mVar28 = next_code[uVar33];
                next_code[uVar33] = mVar28 + 1;
                uVar19 = 0;
                uVar31 = (uint)bVar15;
                while( true ) {
                  bVar38 = uVar31 == 0;
                  uVar31 = uVar31 - 1;
                  if (bVar38) break;
                  uVar19 = (ulong)((mVar28 & 1) + (uint)uVar19 * 2);
                  mVar28 = mVar28 >> 1;
                }
                if (bVar15 < 0xb) {
                  for (; uVar19 < 0x400; uVar19 = uVar19 + (1L << (bVar15 & 0x3f))) {
                    __s[uVar19] = (ushort)uVar25 | (ushort)bVar15 << 9;
                  }
                }
                else {
                  uVar29 = (uint)uVar19 & 0x3ff;
                  uVar31 = (uint)__s[uVar29];
                  if (__s[uVar29] == 0) {
                    __s[uVar29] = (mz_int16)uVar8;
                    uVar31 = uVar8;
                    uVar8 = uVar8 - 2;
                  }
                  uVar19 = uVar19 >> 9;
                  while( true ) {
                    uVar19 = uVar19 >> 1;
                    iVar9 = ((uint)uVar19 & 1) + ~uVar31;
                    if ((uint)uVar33 < 0xc) break;
                    sVar3 = r->m_tables[uVar26].m_tree[iVar9];
                    uVar31 = (uint)sVar3;
                    if (sVar3 == 0) {
                      r->m_tables[uVar26].m_tree[iVar9] = (mz_int16)uVar8;
                      uVar31 = uVar8;
                      uVar8 = uVar8 - 2;
                    }
                    uVar33 = (ulong)((uint)uVar33 - 1);
                  }
                  r->m_tables[uVar26].m_tree[iVar9] = (ushort)uVar25;
                }
              }
            }
            uVar25 = 0;
            if (uVar26 == 2) {
              while( true ) {
                uVar26 = r->m_table_sizes[0];
                uVar16 = r->m_table_sizes[1];
                uVar8 = uVar16 + uVar26;
                uVar34 = uVar25;
                if (uVar8 <= (uint)uVar25) break;
                if (uVar17 < 0xf) {
                  if ((long)puVar1 - (long)local_128 < 2) {
                    do {
                      uVar2 = r->m_tables[2].m_look_up[(uint)local_118 & 0x3ff];
                      uVar26 = (uint)(short)uVar2;
                      if ((short)uVar2 < 0) {
                        if (10 < uVar17) {
                          uVar16 = 0xc;
                          do {
                            sVar3 = r->m_tables[2].m_tree
                                    [(long)(int)~uVar26 +
                                     (ulong)((local_118 >> ((ulong)(uVar16 - 2) & 0x3f) & 1) != 0)];
                            uVar26 = (uint)sVar3;
                            if (-1 < sVar3) break;
                            bVar38 = uVar16 <= uVar17;
                            uVar16 = uVar16 + 1;
                          } while (bVar38);
                          if (-1 < sVar3) break;
                        }
                      }
                      else if ((0x1ff < uVar2) && (uVar26 >> 9 <= uVar17)) break;
                      if (local_128 < puVar1) {
LAB_0011b8d9:
                        uVar25 = (ulong)(byte)*local_128;
                        local_128 = (uint *)((long)local_128 + 1);
                      }
                      else {
LAB_0011bdf1:
                        uVar25 = 0;
                        if ((decomp_flags & 2) != 0) {
                          tVar7 = 0x10;
                          uVar25 = uVar34;
                          goto LAB_0011cd8f;
                        }
                      }
                      local_118 = local_118 | uVar25 << ((byte)uVar17 & 0x3f);
                      uVar17 = uVar17 + 8;
                    } while (uVar17 < 0xf);
                  }
                  else {
                    local_118 = local_118 |
                                (ulong)*(byte *)((long)local_128 + 1) << ((byte)uVar17 + 8 & 0x3f) |
                                (ulong)(byte)*local_128 << ((byte)uVar17 & 0x3f);
                    local_128 = (uint *)((long)local_128 + 2);
                    uVar17 = uVar17 | 0x10;
                  }
                }
                uVar26 = (uint)r->m_tables[2].m_look_up[(uint)local_118 & 0x3ff];
                local_120 = (ulong)uVar26;
                if ((int)uVar26 < 0) {
                  uVar25 = 10;
                  do {
                    uVar16 = (int)uVar25 + 1;
                    uVar26 = (uint)r->m_tables[2].m_tree
                                   [(long)(int)~(uint)local_120 +
                                    (ulong)((local_118 >> (uVar25 & 0x3f) & 1) != 0)];
                    local_120 = (ulong)uVar26;
                    uVar25 = (ulong)uVar16;
                  } while ((int)uVar26 < 0);
                }
                else {
                  uVar16 = uVar26 >> 9;
                  local_120 = (ulong)(uVar26 & 0x1ff);
                }
                local_118 = local_118 >> ((byte)uVar16 & 0x3f);
                uVar17 = uVar17 - uVar16;
                uVar26 = (uint)local_120;
                if (uVar26 < 0x10) {
                  uVar25 = (ulong)((int)uVar34 + 1);
                  r->m_len_codes[uVar34] = (mz_uint8)local_120;
                }
                else {
                  if ((uVar26 == 0x10) && ((int)uVar34 == 0)) {
                    uVar25 = 0;
                    local_120._0_4_ = 0x10;
                    tVar7 = 0x11;
                    goto LAB_0011c003;
                  }
                  uVar25 = (ulong)(uVar26 - 0x10);
                  local_13c = (uint)"\x02\x03\a"[uVar25];
                  if (uVar17 < local_13c) {
                    do {
                      if (local_128 < puVar1) {
LAB_0011ba65:
                        uVar25 = (ulong)(byte)*local_128;
                        local_128 = (uint *)((long)local_128 + 1);
                      }
                      else {
LAB_0011c71b:
                        uVar25 = 0;
                        if ((decomp_flags & 2) != 0) {
                          tVar7 = 0x12;
                          uVar25 = uVar34;
                          goto LAB_0011cd8f;
                        }
                      }
                      local_118 = uVar25 << ((byte)uVar17 & 0x3f) | local_118;
                      uVar17 = uVar17 + 8;
                    } while (uVar17 < local_13c);
                    uVar25 = (ulong)((int)local_120 - 0x10);
                  }
                  uVar26 = (uint)local_118;
                  local_118 = local_118 >> ((byte)local_13c & 0x3f);
                  uVar17 = uVar17 - local_13c;
                  uVar26 = (int)"\x03\x03\v"[uVar25] + (uVar26 & ~(-1 << ((byte)local_13c & 0x1f)));
                  bVar15 = 0;
                  if ((uint)local_120 == 0x10) {
                    bVar15 = r->m_len_codes[(int)uVar34 - 1];
                  }
                  memset(r->m_len_codes + uVar34,(uint)bVar15,(ulong)uVar26);
                  uVar25 = (ulong)((int)uVar34 + uVar26);
                }
              }
              if ((uint)uVar25 != uVar8) {
                tVar7 = 0x15;
                bVar4 = false;
                local_fc = TINFL_STATUS_FAILED;
                bVar38 = false;
                goto LAB_0011cd92;
              }
              memcpy(r->m_tables,r->m_len_codes,(ulong)uVar26);
              memcpy(r->m_tables + 1,r->m_len_codes + uVar26,(ulong)uVar16);
              uVar26 = r->m_type;
            }
            uVar26 = uVar26 - 1;
            r->m_type = uVar26;
          }
LAB_0011cad0:
          do {
            uStack_150 = 10;
            while( true ) {
              bVar15 = (byte)uVar17;
              if (((long)puVar1 - (long)local_128 < 4) || ((long)pmVar18 - (long)pmVar37 < 2))
              break;
              if (uVar17 < 0x1e) {
                local_118 = local_118 | (ulong)*local_128 << (bVar15 & 0x3f);
                local_128 = local_128 + 1;
                uVar17 = uVar17 | 0x20;
              }
              uVar26 = (uint)r->m_tables[0].m_look_up[(uint)local_118 & 0x3ff];
              uVar34 = (ulong)uVar26;
              uVar25 = uStack_150;
              if ((int)uVar26 < 0) {
                do {
                  uVar26 = (int)uVar25 + 1;
                  uVar16 = (uint)r->m_tables[0].m_tree
                                 [(long)(int)~(uint)uVar34 +
                                  (ulong)((local_118 >> (uVar25 & 0x3f) & 1) != 0)];
                  uVar34 = (ulong)uVar16;
                  uVar25 = (ulong)uVar26;
                } while ((int)uVar16 < 0);
              }
              else {
                uVar26 = uVar26 >> 9;
              }
              local_118 = local_118 >> ((byte)uVar26 & 0x3f);
              uVar17 = uVar17 - uVar26;
              uVar26 = (uint)uVar34;
              if ((uVar26 >> 8 & 1) != 0) goto LAB_0011c9f4;
              uVar26 = (uint)r->m_tables[0].m_look_up[(uint)local_118 & 0x3ff];
              uVar25 = uStack_150;
              if ((int)uVar26 < 0) {
                do {
                  uVar16 = (int)uVar25 + 1;
                  uVar26 = (uint)r->m_tables[0].m_tree
                                 [(long)(int)~uVar26 +
                                  (ulong)((local_118 >> (uVar25 & 0x3f) & 1) != 0)];
                  uVar25 = (ulong)uVar16;
                } while ((int)uVar26 < 0);
              }
              else {
                uVar16 = uVar26 >> 9;
              }
              local_118 = local_118 >> ((byte)uVar16 & 0x3f);
              uVar17 = uVar17 - uVar16;
              *pmVar37 = (mz_uint8)uVar34;
              if ((uVar26 >> 8 & 1) != 0) {
                pmVar37 = pmVar37 + 1;
                goto LAB_0011c9f4;
              }
              pmVar37[1] = (mz_uint8)uVar26;
              pmVar37 = pmVar37 + 2;
            }
            if (uVar17 < 0xf) {
              if ((long)puVar1 - (long)local_128 < 2) {
                do {
                  uVar2 = r->m_tables[0].m_look_up[(uint)local_118 & 0x3ff];
                  uVar26 = (uint)(short)uVar2;
                  if ((short)uVar2 < 0) {
                    if (10 < uVar17) {
                      uVar16 = 0xc;
                      do {
                        sVar3 = r->m_tables[0].m_tree
                                [(long)(int)~uVar26 +
                                 (ulong)((local_118 >> ((ulong)(uVar16 - 2) & 0x3f) & 1) != 0)];
                        uVar26 = (uint)sVar3;
                        if (-1 < sVar3) break;
                        bVar38 = uVar16 <= uVar17;
                        uVar16 = uVar16 + 1;
                      } while (bVar38);
                      if (-1 < sVar3) break;
                    }
                  }
                  else if ((0x1ff < uVar2) && (uVar26 >> 9 <= uVar17)) break;
                  uVar25 = uVar34;
                  if (local_128 < puVar1) {
LAB_0011b730:
                    uVar33 = (ulong)(byte)*local_128;
                    local_128 = (uint *)((long)local_128 + 1);
                  }
                  else {
LAB_0011c97c:
                    uVar33 = 0;
                    uVar34 = uVar25;
                    if ((decomp_flags & 2) != 0) {
                      tVar7 = 0x17;
                      goto LAB_0011cd8f;
                    }
                  }
                  local_118 = local_118 | uVar33 << ((byte)uVar17 & 0x3f);
                  uVar17 = uVar17 + 8;
                } while (uVar17 < 0xf);
              }
              else {
                local_118 = local_118 |
                            (ulong)*(byte *)((long)local_128 + 1) << (bVar15 + 8 & 0x3f) |
                            (ulong)(byte)*local_128 << (bVar15 & 0x3f);
                local_128 = (uint *)((long)local_128 + 2);
                uVar17 = uVar17 | 0x10;
              }
            }
            uVar26 = (uint)r->m_tables[0].m_look_up[(uint)local_118 & 0x3ff];
            uVar34 = (ulong)uVar26;
            if ((int)uVar26 < 0) {
              uVar25 = 10;
              do {
                uVar16 = (int)uVar25 + 1;
                uVar26 = (uint)r->m_tables[0].m_tree
                               [(long)(int)~(uint)uVar34 +
                                (ulong)((local_118 >> (uVar25 & 0x3f) & 1) != 0)];
                uVar34 = (ulong)uVar26;
                uVar25 = (ulong)uVar16;
              } while ((int)uVar26 < 0);
            }
            else {
              uVar16 = uVar26 >> 9;
              uVar34 = (ulong)(uVar26 & 0x1ff);
            }
            local_118 = local_118 >> ((byte)uVar16 & 0x3f);
            uVar17 = uVar17 - uVar16;
            uVar26 = (uint)uVar34;
            if (0xff < uVar26) {
LAB_0011c9f4:
              uVar34 = 0x100;
              if ((uVar26 & 0x1ff) != 0x100) {
                uVar25 = (ulong)((uVar26 & 0x1ff) - 0x101);
                uVar34 = (ulong)(uint)tinfl_decompress::s_length_base[uVar25];
                local_13c = 0;
                if (0xffffffffffffffeb < uVar25 - 0x1c) {
                  local_13c = tinfl_decompress::s_length_extra[uVar25];
                  uVar25 = local_118;
                  for (; uVar17 < local_13c; uVar17 = uVar17 + 8) {
                    local_118 = uVar25;
                    uVar25 = uVar34;
                    if (local_128 < puVar1) {
LAB_0011ba31:
                      uVar33 = (ulong)(byte)*local_128;
                      local_128 = (uint *)((long)local_128 + 1);
                    }
                    else {
LAB_0011be77:
                      uVar33 = 0;
                      uVar34 = uVar25;
                      if ((decomp_flags & 2) != 0) {
                        tVar7 = 0x19;
                        goto LAB_0011cd8f;
                      }
                    }
                    uVar25 = local_118 | uVar33 << ((byte)uVar17 & 0x3f);
                  }
                  local_118 = uVar25 >> ((byte)local_13c & 0x3f);
                  uVar17 = uVar17 - local_13c;
                  uVar34 = (ulong)(((uint)uVar25 & ~(-1 << ((byte)local_13c & 0x1f))) + (int)uVar34)
                  ;
                }
                if (uVar17 < 0xf) {
                  if ((long)puVar1 - (long)local_128 < 2) {
                    do {
                      uVar2 = r->m_tables[1].m_look_up[(uint)local_118 & 0x3ff];
                      uVar26 = (uint)(short)uVar2;
                      if ((short)uVar2 < 0) {
                        if (10 < uVar17) {
                          uVar16 = 0xc;
                          do {
                            sVar3 = r->m_tables[1].m_tree
                                    [(long)(int)~uVar26 +
                                     (ulong)((local_118 >> ((ulong)(uVar16 - 2) & 0x3f) & 1) != 0)];
                            uVar26 = (uint)sVar3;
                            if (-1 < sVar3) break;
                            bVar38 = uVar16 <= uVar17;
                            uVar16 = uVar16 + 1;
                          } while (bVar38);
                          if (-1 < sVar3) break;
                        }
                      }
                      else if ((0x1ff < uVar2) && (uVar26 >> 9 <= uVar17)) break;
                      uVar25 = uVar34;
                      if (local_128 < puVar1) {
LAB_0011b9a7:
                        uVar33 = (ulong)(byte)*local_128;
                        local_128 = (uint *)((long)local_128 + 1);
                      }
                      else {
LAB_0011cb35:
                        uVar33 = 0;
                        uVar34 = uVar25;
                        if ((decomp_flags & 2) != 0) {
                          tVar7 = 0x1a;
                          goto LAB_0011cd8f;
                        }
                      }
                      local_118 = local_118 | uVar33 << ((byte)uVar17 & 0x3f);
                      uVar17 = uVar17 + 8;
                    } while (uVar17 < 0xf);
                  }
                  else {
                    local_118 = local_118 |
                                (ulong)*(byte *)((long)local_128 + 1) << ((byte)uVar17 + 8 & 0x3f) |
                                (ulong)(byte)*local_128 << ((byte)uVar17 & 0x3f);
                    local_128 = (uint *)((long)local_128 + 2);
                    uVar17 = uVar17 | 0x10;
                  }
                }
                sVar3 = r->m_tables[1].m_look_up[(uint)local_118 & 0x3ff];
                uVar26 = (uint)sVar3;
                if (sVar3 < 0) {
                  uVar25 = 10;
                  do {
                    uVar16 = (int)uVar25 + 1;
                    sVar3 = r->m_tables[1].m_tree
                            [(long)(int)~uVar26 + (ulong)((local_118 >> (uVar25 & 0x3f) & 1) != 0)];
                    uVar26 = (uint)sVar3;
                    uVar25 = (ulong)uVar16;
                  } while (sVar3 < 0);
                }
                else {
                  uVar16 = uVar26 >> 9;
                  uVar26 = uVar26 & 0x1ff;
                }
                local_118 = local_118 >> ((byte)uVar16 & 0x3f);
                uVar17 = uVar17 - uVar16;
                uVar33 = (ulong)uVar26;
                local_120 = (ulong)(uint)tinfl_decompress::s_dist_base[uVar33];
                local_13c = 0;
                uVar25 = uVar34;
                if (0xffffffffffffffe5 < uVar33 - 0x1e) {
                  local_13c = tinfl_decompress::s_dist_extra[uVar33];
                  uVar33 = local_118;
                  for (; uVar25 = uVar34, uVar17 < local_13c; uVar17 = uVar17 + 8) {
                    local_118 = uVar33;
                    if (local_128 < puVar1) {
LAB_0011ba99:
                      uVar33 = (ulong)(byte)*local_128;
                      local_128 = (uint *)((long)local_128 + 1);
                    }
                    else {
LAB_0011cbe0:
                      uVar33 = 0;
                      uVar34 = uVar25;
                      if ((decomp_flags & 2) != 0) {
                        tVar7 = 0x1b;
                        goto LAB_0011cd8f;
                      }
                    }
                    uVar33 = local_118 | uVar33 << ((byte)uVar17 & 0x3f);
                  }
                  local_118 = uVar33 >> ((byte)local_13c & 0x3f);
                  local_120 = (ulong)(((uint)uVar33 & ~(-1 << ((byte)local_13c & 0x1f))) +
                                     (uint)local_120);
                  uVar17 = uVar17 - local_13c;
                }
                uVar26 = (uint)uVar25;
                local_138 = (long)pmVar37 - (long)pOut_buf_start;
                if (((decomp_flags & 4) != 0) && (local_138 < local_120)) {
                  tVar7 = 0x25;
                  goto LAB_0011c002;
                }
                pmVar13 = pOut_buf_start + (local_138 - local_120 & uVar35);
                pmVar20 = pmVar13;
                if (pmVar13 < pmVar37) {
                  pmVar20 = pmVar37;
                }
                if (pmVar18 < pmVar20 + uVar25) {
                  while (uVar34 = (ulong)((int)uVar25 - 1), sVar30 = local_138, (int)uVar25 != 0) {
LAB_0011cd29:
                    if (pmVar18 <= pmVar37) {
                      tVar7 = 0x35;
                      local_138 = sVar30;
                      goto LAB_0011c191;
                    }
                    local_138 = sVar30 + 1;
                    *pmVar37 = pOut_buf_start[sVar30 - local_120 & uVar35];
                    pmVar37 = pmVar37 + 1;
                    uVar25 = uVar34;
                  }
                  uStack_150 = 0xffffffffffffffff;
                  uVar34 = uStack_150;
                  goto LAB_0011cad0;
                }
                if ((8 < uVar26) && (uVar26 <= (uint)local_120)) {
                  pmVar20 = pmVar13 + (uVar26 & 0xfffffff8);
                  do {
                    pmVar36 = pmVar37;
                    pmVar14 = pmVar13;
                    *(undefined4 *)pmVar36 = *(undefined4 *)pmVar14;
                    *(undefined4 *)(pmVar36 + 4) = *(undefined4 *)(pmVar14 + 4);
                    pmVar37 = pmVar36 + 8;
                    pmVar13 = pmVar14 + 8;
                  } while (pmVar13 < pmVar20);
                  uVar26 = uVar26 & 7;
                  uVar34 = (ulong)uVar26;
                  if (uVar26 < 3) {
                    if ((uVar25 & 7) != 0) {
                      *pmVar37 = *pmVar13;
                      if (uVar26 == 2) {
                        pmVar36[9] = pmVar14[9];
                      }
                      pmVar37 = pmVar37 + uVar26;
                    }
                    goto LAB_0011cad0;
                  }
                }
                uVar34 = (ulong)(uVar26 - 3) + 3;
                do {
                  pmVar14 = pmVar37;
                  pmVar20 = pmVar13;
                  *pmVar14 = *pmVar20;
                  pmVar14[1] = pmVar20[1];
                  pmVar14[2] = pmVar20[2];
                  pmVar37 = pmVar14 + 3;
                  uVar34 = uVar34 - 3;
                  iVar9 = (int)uVar34;
                  pmVar13 = pmVar20 + 3;
                } while (2 < iVar9);
                if (0 < iVar9) {
                  *pmVar37 = pmVar20[3];
                  if (iVar9 == 2) {
                    pmVar14[4] = pmVar20[4];
                  }
                  pmVar37 = pmVar37 + uVar34;
                }
                goto LAB_0011cad0;
              }
              goto LAB_0011ca08;
            }
LAB_0011ca2b:
            if (pmVar18 <= pmVar37) {
              tVar7 = 0x18;
              goto LAB_0011c191;
            }
            *pmVar37 = (mz_uint8)uVar34;
            pmVar37 = pmVar37 + 1;
          } while( true );
        }
        uVar34 = 0;
        if (uVar26 != 3) {
          for (; (uint)uVar34 < 3; uVar34 = (ulong)((int)uVar34 + 1)) {
            bVar15 = "\x05\x05\x04"[uVar34];
            local_118 = uVar33;
            while( true ) {
              if ((uint)(int)(char)bVar15 <= uVar17) break;
              if (local_128 < puVar1) {
LAB_0011b7b6:
                uVar25 = (ulong)(byte)*local_128;
                local_128 = (uint *)((long)local_128 + 1);
              }
              else {
LAB_0011c274:
                uVar25 = 0;
                if ((decomp_flags & 2) != 0) {
                  tVar7 = 0xb;
                  uVar25 = uVar34;
                  goto LAB_0011cd8f;
                }
              }
              local_118 = local_118 | uVar25 << ((byte)uVar17 & 0x3f);
              uVar17 = uVar17 + 8;
              bVar15 = "\x05\x05\x04"[uVar34];
            }
            uVar33 = local_118 >> (bVar15 & 0x3f);
            uVar17 = uVar17 - (int)(char)bVar15;
            r->m_table_sizes[uVar34] =
                 ((uint)local_118 & ~(-1 << (bVar15 & 0x1f))) +
                 tinfl_decompress::s_min_table_sizes[uVar34];
          }
          memset(r->m_tables + 2,0,0x120);
          uVar25 = 0;
          while (local_118 = uVar33, uVar34 = uVar25, (uint)uVar25 < r->m_table_sizes[2]) {
            for (; uVar17 < 3; uVar17 = uVar17 + 8) {
              if (local_128 < puVar1) {
LAB_0011b6fc:
                uVar25 = (ulong)(byte)*local_128;
                local_128 = (uint *)((long)local_128 + 1);
              }
              else {
LAB_0011c55c:
                uVar25 = 0;
                if ((decomp_flags & 2) != 0) {
                  tVar7 = 0xe;
                  uVar25 = uVar34;
                  goto LAB_0011cd8f;
                }
              }
              bVar15 = (byte)uVar17;
              local_118 = local_118 | uVar25 << (bVar15 & 0x3f);
            }
            uVar33 = local_118 >> 3;
            uVar17 = uVar17 - 3;
            r->m_tables[2].m_code_size["\x10\x11\x12"[uVar34]] = (byte)local_118 & 7;
            uVar25 = (ulong)((int)uVar34 + 1);
          }
          r->m_table_sizes[2] = 0x13;
          goto LAB_0011c2f5;
        }
        tVar7 = 10;
LAB_0011c002:
LAB_0011c003:
        bVar38 = false;
        local_fc = TINFL_STATUS_FAILED;
        goto LAB_0011cd91;
      }
LAB_0011becc:
      local_118 = uVar33 >> ((byte)uVar17 & 7);
      uVar17 = uVar17 & 0xfffffff8;
      uVar34 = 0;
      while( true ) {
        uVar16 = (uint)uVar34;
        if (3 < uVar16) break;
        if (uVar17 == 0) {
          uVar17 = 0;
          if (local_128 < puVar1) {
            uVar17 = *local_128;
            local_128 = (uint *)((long)local_128 + 1);
            r->m_raw_header[uVar34] = (byte)uVar17;
            uVar17 = 0;
          }
          else {
LAB_0011bfe6:
            uVar16 = (uint)uVar34;
            if ((decomp_flags & 2) != 0) {
              tVar7 = 7;
              uVar25 = uVar34;
              goto LAB_0011cd8f;
            }
            r->m_raw_header[uVar34] = '\0';
          }
        }
        else {
          uVar26 = uVar17;
          if (uVar17 < 8) {
            do {
              if (local_128 < puVar1) {
LAB_0011b764:
                uVar25 = (ulong)(byte)*local_128;
                local_128 = (uint *)((long)local_128 + 1);
              }
              else {
LAB_0011c055:
                uVar25 = 0;
                if ((decomp_flags & 2) != 0) {
                  tVar7 = 6;
                  uVar25 = uVar34;
                  goto LAB_0011cd8f;
                }
              }
              local_118 = local_118 | uVar25 << ((byte)uVar17 & 0x3f);
              uVar26 = uVar17 + 8;
              bVar38 = 0xfffffff7 < uVar17;
              uVar17 = uVar26;
            } while (bVar38);
          }
          uVar16 = (uint)uVar34;
          r->m_raw_header[uVar34] = (mz_uint8)local_118;
          local_118 = local_118 >> 8;
          uVar17 = uVar26 - 8;
        }
LAB_0011bff7:
        uVar34 = (ulong)(uVar16 + 1);
      }
      uVar25 = (ulong)*(ushort *)r->m_raw_header;
      if ((*(ushort *)(r->m_raw_header + 2) ^ *(ushort *)r->m_raw_header) != 0xffff) {
        tVar7 = 0x27;
        goto LAB_0011c003;
      }
      while (((int)uVar25 != 0 && (uVar17 != 0))) {
        uVar26 = uVar17;
        if (uVar17 < 8) {
          do {
            uVar34 = uVar25;
            if (local_128 < puVar1) {
LAB_0011bacd:
              uVar33 = (ulong)(byte)*local_128;
              local_128 = (uint *)((long)local_128 + 1);
              uVar25 = uVar34;
            }
            else {
LAB_0011c1a3:
              uVar33 = 0;
              uVar25 = uVar34;
              if ((decomp_flags & 2) != 0) {
                tVar7 = 0x33;
                goto LAB_0011cd8f;
              }
            }
            local_118 = local_118 | uVar33 << ((byte)uVar17 & 0x3f);
            uVar26 = uVar17 + 8;
            bVar38 = 0xfffffff7 < uVar17;
            uVar17 = uVar26;
          } while (bVar38);
        }
        local_120 = local_118 & 0xff;
        local_118 = local_118 >> 8;
        uVar17 = uVar26 - 8;
        uVar34 = uVar25;
LAB_0011c0af:
        if (pmVar18 <= pmVar37) {
          tVar7 = 0x34;
          goto LAB_0011c191;
        }
        *pmVar37 = (mz_uint8)local_120;
        pmVar37 = pmVar37 + 1;
        uVar25 = (ulong)((int)uVar34 - 1);
      }
LAB_0011c0cc:
      uVar34 = uVar25;
      if ((int)uVar25 != 0) {
LAB_0011c0da:
        uVar25 = uVar34;
        if (pmVar18 <= pmVar37) {
          tVar7 = 9;
LAB_0011c191:
          bVar4 = false;
          local_fc = TINFL_STATUS_HAS_MORE_OUTPUT;
          bVar38 = true;
          goto LAB_0011cd92;
        }
LAB_0011c0ef:
        if (local_128 < puVar1) goto code_r0x0011c0f4;
        if ((decomp_flags & 2) != 0) {
          tVar7 = 0x26;
          goto LAB_0011cd8f;
        }
        tVar7 = 0x28;
        goto LAB_0011c003;
      }
      uVar34 = 0;
LAB_0011ca08:
      uVar25 = uVar34;
    } while ((r->m_final & 1) == 0);
    if ((decomp_flags & 1) != 0) {
LAB_0011caa8:
      local_118 = local_118 >> ((byte)uVar17 & 7);
      uVar34 = 0;
      uVar8 = uVar17 & 0xfffffff8;
      while( true ) {
        uVar16 = (uint)uVar34;
        uVar17 = uVar8;
        if (3 < uVar16) break;
        if (uVar8 == 0) {
          uVar17 = 0;
          if (local_128 < puVar1) {
            uVar26 = (uint)(byte)*local_128;
            local_128 = (uint *)((long)local_128 + 1);
            uVar17 = 0;
            goto LAB_0011be08;
          }
LAB_0011be4d:
          uVar16 = (uint)uVar34;
          uVar26 = 0;
          if ((decomp_flags & 2) == 0) goto LAB_0011be08;
          tVar7 = 0x2a;
          uVar25 = uVar34;
LAB_0011cd8f:
          bVar38 = true;
          local_fc = TINFL_STATUS_NEEDS_MORE_INPUT;
LAB_0011cd91:
          bVar4 = false;
          uVar34 = uVar25;
          goto LAB_0011cd92;
        }
        if (uVar8 < 8) {
          do {
            if (local_128 < puVar1) {
LAB_0011b973:
              uVar35 = (ulong)(byte)*local_128;
              local_128 = (uint *)((long)local_128 + 1);
            }
            else {
LAB_0011cd69:
              uVar35 = 0;
              if ((decomp_flags & 2) != 0) {
                tVar7 = 0x29;
                uVar25 = uVar34;
                goto LAB_0011cd8f;
              }
            }
            uVar16 = (uint)uVar34;
            local_118 = local_118 | uVar35 << ((byte)uVar17 & 0x3f);
            uVar8 = uVar17 + 8;
            bVar38 = 0xfffffff7 < uVar17;
            uVar17 = uVar8;
          } while (bVar38);
        }
        uVar26 = (uint)local_118 & 0xff;
        local_118 = local_118 >> 8;
        uVar17 = uVar8 - 8;
LAB_0011be08:
        r->m_z_adler32 = r->m_z_adler32 << 8 | uVar26;
        uVar34 = (ulong)(uVar16 + 1);
        uVar8 = uVar17;
      }
    }
    tVar7 = 0x22;
    bVar4 = true;
    local_fc = TINFL_STATUS_DONE;
    bVar38 = true;
    break;
  case TINFL_STATUS_HAS_MORE_OUTPUT|TINFL_STATUS_NEEDS_MORE_INPUT:
    if ((long)sVar30 < 1) goto LAB_0011c016;
    goto LAB_0011b7ea;
  default:
    goto LAB_0011bb35;
  case 5:
    if (0 < (long)sVar30) {
      uVar25 = (ulong)*pIn_buf_next;
      local_128 = (uint *)(pIn_buf_next + 1);
LAB_0011bb8a:
      uVar33 = local_118 | uVar25 << ((byte)uVar17 & 0x3f);
      uVar17 = uVar17 + 8;
      goto LAB_0011becc;
    }
    uVar25 = 0;
    if ((decomp_flags & 2) == 0) goto LAB_0011bb8a;
    tVar7 = 5;
LAB_0011bd66:
    bVar4 = false;
    bVar38 = true;
    break;
  case 6:
    if ((long)sVar30 < 1) goto LAB_0011c055;
    goto LAB_0011b764;
  case 7:
    if ((long)sVar30 < 1) goto LAB_0011bfe6;
    local_128 = (uint *)(pIn_buf_next + 1);
    r->m_raw_header[uVar34] = *pIn_buf_next;
    goto LAB_0011bff7;
  case 9:
    goto LAB_0011c0da;
  case 10:
  case 0x11:
  case 0x15:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x27:
  case 0x28:
    bVar4 = false;
    local_fc = TINFL_STATUS_FAILED;
    bVar38 = false;
    break;
  case 0xb:
    if ((long)sVar30 < 1) goto LAB_0011c274;
    goto LAB_0011b7b6;
  case 0xe:
    if ((long)sVar30 < 1) goto LAB_0011c55c;
    goto LAB_0011b6fc;
  case 0x10:
    if ((long)sVar30 < 1) goto LAB_0011bdf1;
    goto LAB_0011b8d9;
  case 0x12:
    if ((long)sVar30 < 1) goto LAB_0011c71b;
    goto LAB_0011ba65;
  case 0x17:
    if ((long)sVar30 < 1) goto LAB_0011c97c;
    goto LAB_0011b730;
  case 0x18:
    goto LAB_0011ca2b;
  case 0x19:
    if ((long)sVar30 < 1) goto LAB_0011be77;
    goto LAB_0011ba31;
  case 0x1a:
    if ((long)sVar30 < 1) goto LAB_0011cb35;
    goto LAB_0011b9a7;
  case 0x1b:
    if ((long)sVar30 < 1) goto LAB_0011cbe0;
    goto LAB_0011ba99;
  case 0x20:
    if ((long)sVar30 < 1) {
      uVar35 = 0;
      if ((decomp_flags & 2) != 0) {
        tVar7 = 0x20;
        goto LAB_0011bd66;
      }
    }
    else {
      uVar35 = (ulong)*pIn_buf_next;
      local_128 = (uint *)(pIn_buf_next + 1);
    }
    local_118 = local_118 | uVar35 << ((byte)uVar17 & 0x3f);
    uVar17 = uVar17 + 8;
    goto LAB_0011caa8;
  case 0x22:
    local_fc = TINFL_STATUS_DONE;
    bVar38 = true;
    bVar4 = true;
    break;
  case 0x26:
    goto LAB_0011c0ef;
  case 0x29:
    if ((long)sVar30 < 1) goto LAB_0011cd69;
    goto LAB_0011b973;
  case 0x2a:
    if ((long)sVar30 < 1) goto LAB_0011be4d;
    local_128 = (uint *)(pIn_buf_next + 1);
    uVar26 = (uint)*pIn_buf_next;
    goto LAB_0011be08;
  case 0x33:
    if ((long)sVar30 < 1) goto LAB_0011c1a3;
    goto LAB_0011bacd;
  case 0x34:
    goto LAB_0011c0af;
  case 0x35:
    sVar30 = local_138;
    goto LAB_0011cd29;
  }
LAB_0011cd92:
  uVar16 = (uint)uVar34;
  r->m_state = tVar7;
LAB_0011cd99:
  r->m_num_bits = uVar17;
  r->m_bit_buf = local_118;
  r->m_dist = (uint)local_120;
  r->m_counter = uVar16;
  r->m_num_extra = local_13c;
  r->m_dist_from_out_buf_start = local_138;
  *pIn_buf_size = (long)local_128 - (long)pIn_buf_next;
  uVar35 = (long)pmVar37 - (long)pOut_buf_next;
  *pOut_buf_size = uVar35;
  if (bVar38 && (decomp_flags & 8) != 0) {
    uVar26 = r->m_check_adler32 & 0xffff;
    uVar17 = r->m_check_adler32 >> 0x10;
    uVar34 = uVar35 % 0x15b0;
    while (uVar35 != 0) {
      for (lVar32 = 0; (int)lVar32 + 7U < (uint)uVar34; lVar32 = lVar32 + 8) {
        iVar27 = uVar26 + pOut_buf_next[lVar32];
        iVar9 = (uint)pOut_buf_next[lVar32 + 1] + iVar27;
        iVar21 = (uint)pOut_buf_next[lVar32 + 2] + iVar9;
        iVar10 = (uint)pOut_buf_next[lVar32 + 3] + iVar21;
        iVar22 = (uint)pOut_buf_next[lVar32 + 4] + iVar10;
        iVar11 = (uint)pOut_buf_next[lVar32 + 5] + iVar22;
        iVar23 = (uint)pOut_buf_next[lVar32 + 6] + iVar11;
        uVar26 = (uint)pOut_buf_next[lVar32 + 7] + iVar23;
        uVar17 = uVar17 + iVar27 + iVar9 + iVar21 + iVar10 + iVar22 + iVar11 + iVar23 + uVar26;
      }
      for (; (uint)lVar32 < (uint)uVar34; lVar32 = lVar32 + 1) {
        uVar26 = uVar26 + pOut_buf_next[lVar32];
        uVar17 = uVar17 + uVar26;
      }
      uVar26 = uVar26 % 0xfff1;
      uVar17 = uVar17 % 0xfff1;
      pOut_buf_next = pOut_buf_next + lVar32;
      uVar35 = uVar35 - uVar34;
      uVar34 = 0x15b0;
    }
    uVar26 = uVar17 << 0x10 | uVar26;
    r->m_check_adler32 = uVar26;
    if ((bVar4) && (local_fc = TINFL_STATUS_DONE, (decomp_flags & 1) != 0)) {
      local_fc = (uint)(uVar26 == r->m_z_adler32) * 2 + TINFL_STATUS_ADLER32_MISMATCH;
    }
  }
  return local_fc;
code_r0x0011c0f4:
  uVar34 = (long)puVar1 - (long)local_128;
  if ((ulong)((long)pmVar18 - (long)pmVar37) < (ulong)((long)puVar1 - (long)local_128)) {
    uVar34 = (long)pmVar18 - (long)pmVar37;
  }
  if (uVar25 <= uVar34) {
    uVar34 = uVar25;
  }
  memcpy(pmVar37,local_128,uVar34);
  local_128 = (uint *)((long)local_128 + uVar34);
  pmVar37 = pmVar37 + uVar34;
  uVar25 = (ulong)(uint)((int)uVar25 - (int)uVar34);
  goto LAB_0011c0cc;
}

Assistant:

tinfl_status tinfl_decompress(tinfl_decompressor *r, const mz_uint8 *pIn_buf_next, size_t *pIn_buf_size, mz_uint8 *pOut_buf_start, mz_uint8 *pOut_buf_next, size_t *pOut_buf_size, const mz_uint32 decomp_flags)
{
  static const int s_length_base[31] = { 3,4,5,6,7,8,9,10,11,13, 15,17,19,23,27,31,35,43,51,59, 67,83,99,115,131,163,195,227,258,0,0 };
  static const int s_length_extra[31]= { 0,0,0,0,0,0,0,0,1,1,1,1,2,2,2,2,3,3,3,3,4,4,4,4,5,5,5,5,0,0,0 };
  static const int s_dist_base[32] = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193, 257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577,0,0};
  static const int s_dist_extra[32] = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13};
  static const mz_uint8 s_length_dezigzag[19] = { 16,17,18,0,8,7,9,6,10,5,11,4,12,3,13,2,14,1,15 };
  static const int s_min_table_sizes[3] = { 257, 1, 4 };

  tinfl_status status = TINFL_STATUS_FAILED; mz_uint32 num_bits, dist, counter, num_extra; tinfl_bit_buf_t bit_buf;
  const mz_uint8 *pIn_buf_cur = pIn_buf_next, *const pIn_buf_end = pIn_buf_next + *pIn_buf_size;
  mz_uint8 *pOut_buf_cur = pOut_buf_next, *const pOut_buf_end = pOut_buf_next + *pOut_buf_size;
  size_t out_buf_size_mask = (decomp_flags & TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF) ? (size_t)-1 : ((pOut_buf_next - pOut_buf_start) + *pOut_buf_size) - 1, dist_from_out_buf_start;

  // Ensure the output buffer's size is a power of 2, unless the output buffer is large enough to hold the entire output file (in which case it doesn't matter).
  if (((out_buf_size_mask + 1) & out_buf_size_mask) || (pOut_buf_next < pOut_buf_start)) { *pIn_buf_size = *pOut_buf_size = 0; return TINFL_STATUS_BAD_PARAM; }

  num_bits = r->m_num_bits; bit_buf = r->m_bit_buf; dist = r->m_dist; counter = r->m_counter; num_extra = r->m_num_extra; dist_from_out_buf_start = r->m_dist_from_out_buf_start;
  TINFL_CR_BEGIN

  bit_buf = num_bits = dist = counter = num_extra = r->m_zhdr0 = r->m_zhdr1 = 0; r->m_z_adler32 = r->m_check_adler32 = 1;
  if (decomp_flags & TINFL_FLAG_PARSE_ZLIB_HEADER)
  {
    TINFL_GET_BYTE(1, r->m_zhdr0); TINFL_GET_BYTE(2, r->m_zhdr1);
    counter = (((r->m_zhdr0 * 256 + r->m_zhdr1) % 31 != 0) || (r->m_zhdr1 & 32) || ((r->m_zhdr0 & 15) != 8));
    if (!(decomp_flags & TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF)) counter |= (((1U << (8U + (r->m_zhdr0 >> 4))) > 32768U) || ((out_buf_size_mask + 1) < (size_t)(1ULL << (8U + (r->m_zhdr0 >> 4)))));
    if (counter) { TINFL_CR_RETURN_FOREVER(36, TINFL_STATUS_FAILED); }
  }

  do
  {
    TINFL_GET_BITS(3, r->m_final, 3); r->m_type = r->m_final >> 1;
    if (r->m_type == 0)
    {
      TINFL_SKIP_BITS(5, num_bits & 7);
      for (counter = 0; counter < 4; ++counter) { if (num_bits) TINFL_GET_BITS(6, r->m_raw_header[counter], 8); else TINFL_GET_BYTE(7, r->m_raw_header[counter]); }
      if ((counter = (r->m_raw_header[0] | (r->m_raw_header[1] << 8))) != (mz_uint)(0xFFFF ^ (r->m_raw_header[2] | (r->m_raw_header[3] << 8)))) { TINFL_CR_RETURN_FOREVER(39, TINFL_STATUS_FAILED); }
      while ((counter) && (num_bits))
      {
        TINFL_GET_BITS(51, dist, 8);
        while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(52, TINFL_STATUS_HAS_MORE_OUTPUT); }
        *pOut_buf_cur++ = (mz_uint8)dist;
        counter--;
      }
      while (counter)
      {
        size_t n; while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(9, TINFL_STATUS_HAS_MORE_OUTPUT); }
        while (pIn_buf_cur >= pIn_buf_end)
        {
          if (decomp_flags & TINFL_FLAG_HAS_MORE_INPUT)
          {
            TINFL_CR_RETURN(38, TINFL_STATUS_NEEDS_MORE_INPUT);
          }
          else
          {
            TINFL_CR_RETURN_FOREVER(40, TINFL_STATUS_FAILED);
          }
        }
        n = MZ_MIN(MZ_MIN((size_t)(pOut_buf_end - pOut_buf_cur), (size_t)(pIn_buf_end - pIn_buf_cur)), counter);
        TINFL_MEMCPY(pOut_buf_cur, pIn_buf_cur, n); pIn_buf_cur += n; pOut_buf_cur += n; counter -= (mz_uint)n;
      }
    }
    else if (r->m_type == 3)
    {
      TINFL_CR_RETURN_FOREVER(10, TINFL_STATUS_FAILED);
    }
    else
    {
      if (r->m_type == 1)
      {
        mz_uint8 *p = r->m_tables[0].m_code_size; mz_uint i;
        r->m_table_sizes[0] = 288; r->m_table_sizes[1] = 32; TINFL_MEMSET(r->m_tables[1].m_code_size, 5, 32);
        for ( i = 0; i <= 143; ++i) *p++ = 8;
        for ( ; i <= 255; ++i) *p++ = 9;
        for ( ; i <= 279; ++i) *p++ = 7;
        for ( ; i <= 287; ++i) *p++ = 8;
      }
      else
      {
        for (counter = 0; counter < 3; counter++) { TINFL_GET_BITS(11, r->m_table_sizes[counter], "\05\05\04"[counter]); r->m_table_sizes[counter] += s_min_table_sizes[counter]; }
        MZ_CLEAR_OBJ(r->m_tables[2].m_code_size); for (counter = 0; counter < r->m_table_sizes[2]; counter++) { mz_uint s; TINFL_GET_BITS(14, s, 3); r->m_tables[2].m_code_size[s_length_dezigzag[counter]] = (mz_uint8)s; }
        r->m_table_sizes[2] = 19;
      }
      for ( ; (int)r->m_type >= 0; r->m_type--)
      {
        int tree_next, tree_cur; tinfl_huff_table *pTable;
        mz_uint i, j, used_syms, total, sym_index, next_code[17], total_syms[16]; pTable = &r->m_tables[r->m_type]; MZ_CLEAR_OBJ(total_syms); MZ_CLEAR_OBJ(pTable->m_look_up); MZ_CLEAR_OBJ(pTable->m_tree);
        for (i = 0; i < r->m_table_sizes[r->m_type]; ++i) total_syms[pTable->m_code_size[i]]++;
        used_syms = 0, total = 0; next_code[0] = next_code[1] = 0;
        for (i = 1; i <= 15; ++i) { used_syms += total_syms[i]; next_code[i + 1] = (total = ((total + total_syms[i]) << 1)); }
        if ((65536 != total) && (used_syms > 1))
        {
          TINFL_CR_RETURN_FOREVER(35, TINFL_STATUS_FAILED);
        }
        for (tree_next = -1, sym_index = 0; sym_index < r->m_table_sizes[r->m_type]; ++sym_index)
        {
          mz_uint rev_code = 0, l, cur_code, code_size = pTable->m_code_size[sym_index]; if (!code_size) continue;
          cur_code = next_code[code_size]++; for (l = code_size; l > 0; l--, cur_code >>= 1) rev_code = (rev_code << 1) | (cur_code & 1);
          if (code_size <= TINFL_FAST_LOOKUP_BITS) { mz_int16 k = (mz_int16)((code_size << 9) | sym_index); while (rev_code < TINFL_FAST_LOOKUP_SIZE) { pTable->m_look_up[rev_code] = k; rev_code += (1 << code_size); } continue; }
          if (0 == (tree_cur = pTable->m_look_up[rev_code & (TINFL_FAST_LOOKUP_SIZE - 1)])) { pTable->m_look_up[rev_code & (TINFL_FAST_LOOKUP_SIZE - 1)] = (mz_int16)tree_next; tree_cur = tree_next; tree_next -= 2; }
          rev_code >>= (TINFL_FAST_LOOKUP_BITS - 1);
          for (j = code_size; j > (TINFL_FAST_LOOKUP_BITS + 1); j--)
          {
            tree_cur -= ((rev_code >>= 1) & 1);
            if (!pTable->m_tree[-tree_cur - 1]) { pTable->m_tree[-tree_cur - 1] = (mz_int16)tree_next; tree_cur = tree_next; tree_next -= 2; } else tree_cur = pTable->m_tree[-tree_cur - 1];
          }
          tree_cur -= ((rev_code >>= 1) & 1); pTable->m_tree[-tree_cur - 1] = (mz_int16)sym_index;
        }
        if (r->m_type == 2)
        {
          for (counter = 0; counter < (r->m_table_sizes[0] + r->m_table_sizes[1]); )
          {
            mz_uint s; TINFL_HUFF_DECODE(16, dist, &r->m_tables[2]); if (dist < 16) { r->m_len_codes[counter++] = (mz_uint8)dist; continue; }
            if ((dist == 16) && (!counter))
            {
              TINFL_CR_RETURN_FOREVER(17, TINFL_STATUS_FAILED);
            }
            num_extra = "\02\03\07"[dist - 16]; TINFL_GET_BITS(18, s, num_extra); s += "\03\03\013"[dist - 16];
            TINFL_MEMSET(r->m_len_codes + counter, (dist == 16) ? r->m_len_codes[counter - 1] : 0, s); counter += s;
          }
          if ((r->m_table_sizes[0] + r->m_table_sizes[1]) != counter)
          {
            TINFL_CR_RETURN_FOREVER(21, TINFL_STATUS_FAILED);
          }
          TINFL_MEMCPY(r->m_tables[0].m_code_size, r->m_len_codes, r->m_table_sizes[0]); TINFL_MEMCPY(r->m_tables[1].m_code_size, r->m_len_codes + r->m_table_sizes[0], r->m_table_sizes[1]);
        }
      }
      for ( ; ; )
      {
        mz_uint8 *pSrc;
        for ( ; ; )
        {
          if (((pIn_buf_end - pIn_buf_cur) < 4) || ((pOut_buf_end - pOut_buf_cur) < 2))
          {
            TINFL_HUFF_DECODE(23, counter, &r->m_tables[0]);
            if (counter >= 256)
              break;
            while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(24, TINFL_STATUS_HAS_MORE_OUTPUT); }
            *pOut_buf_cur++ = (mz_uint8)counter;
          }
          else
          {
            int sym2; mz_uint code_len;
#if TINFL_USE_64BIT_BITBUF
            if (num_bits < 30) { bit_buf |= (((tinfl_bit_buf_t)MZ_READ_LE32(pIn_buf_cur)) << num_bits); pIn_buf_cur += 4; num_bits += 32; }
#else
            if (num_bits < 15) { bit_buf |= (((tinfl_bit_buf_t)MZ_READ_LE16(pIn_buf_cur)) << num_bits); pIn_buf_cur += 2; num_bits += 16; }
#endif
            if ((sym2 = r->m_tables[0].m_look_up[bit_buf & (TINFL_FAST_LOOKUP_SIZE - 1)]) >= 0)
              code_len = sym2 >> 9;
            else
            {
              code_len = TINFL_FAST_LOOKUP_BITS; do { sym2 = r->m_tables[0].m_tree[~sym2 + ((bit_buf >> code_len++) & 1)]; } while (sym2 < 0);
            }
            counter = sym2; bit_buf >>= code_len; num_bits -= code_len;
            if (counter & 256)
              break;

#if !TINFL_USE_64BIT_BITBUF
            if (num_bits < 15) { bit_buf |= (((tinfl_bit_buf_t)MZ_READ_LE16(pIn_buf_cur)) << num_bits); pIn_buf_cur += 2; num_bits += 16; }
#endif
            if ((sym2 = r->m_tables[0].m_look_up[bit_buf & (TINFL_FAST_LOOKUP_SIZE - 1)]) >= 0)
              code_len = sym2 >> 9;
            else
            {
              code_len = TINFL_FAST_LOOKUP_BITS; do { sym2 = r->m_tables[0].m_tree[~sym2 + ((bit_buf >> code_len++) & 1)]; } while (sym2 < 0);
            }
            bit_buf >>= code_len; num_bits -= code_len;

            pOut_buf_cur[0] = (mz_uint8)counter;
            if (sym2 & 256)
            {
              pOut_buf_cur++;
              counter = sym2;
              break;
            }
            pOut_buf_cur[1] = (mz_uint8)sym2;
            pOut_buf_cur += 2;
          }
        }
        if ((counter &= 511) == 256) break;

        num_extra = s_length_extra[counter - 257]; counter = s_length_base[counter - 257];
        if (num_extra) { mz_uint extra_bits; TINFL_GET_BITS(25, extra_bits, num_extra); counter += extra_bits; }

        TINFL_HUFF_DECODE(26, dist, &r->m_tables[1]);
        num_extra = s_dist_extra[dist]; dist = s_dist_base[dist];
        if (num_extra) { mz_uint extra_bits; TINFL_GET_BITS(27, extra_bits, num_extra); dist += extra_bits; }

        dist_from_out_buf_start = pOut_buf_cur - pOut_buf_start;
        if ((dist > dist_from_out_buf_start) && (decomp_flags & TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF))
        {
          TINFL_CR_RETURN_FOREVER(37, TINFL_STATUS_FAILED);
        }

        pSrc = pOut_buf_start + ((dist_from_out_buf_start - dist) & out_buf_size_mask);

        if ((MZ_MAX(pOut_buf_cur, pSrc) + counter) > pOut_buf_end)
        {
          while (counter--)
          {
            while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(53, TINFL_STATUS_HAS_MORE_OUTPUT); }
            *pOut_buf_cur++ = pOut_buf_start[(dist_from_out_buf_start++ - dist) & out_buf_size_mask];
          }
          continue;
        }
#if MINIZ_USE_UNALIGNED_LOADS_AND_STORES
        else if ((counter >= 9) && (counter <= dist))
        {
          const mz_uint8 *pSrc_end = pSrc + (counter & ~7);
          do
          {
            ((mz_uint32 *)pOut_buf_cur)[0] = ((const mz_uint32 *)pSrc)[0];
            ((mz_uint32 *)pOut_buf_cur)[1] = ((const mz_uint32 *)pSrc)[1];
            pOut_buf_cur += 8;
          } while ((pSrc += 8) < pSrc_end);
          if ((counter &= 7) < 3)
          {
            if (counter)
            {
              pOut_buf_cur[0] = pSrc[0];
              if (counter > 1)
                pOut_buf_cur[1] = pSrc[1];
              pOut_buf_cur += counter;
            }
            continue;
          }
        }
#endif
        do
        {
          pOut_buf_cur[0] = pSrc[0];
          pOut_buf_cur[1] = pSrc[1];
          pOut_buf_cur[2] = pSrc[2];
          pOut_buf_cur += 3; pSrc += 3;
        } while ((int)(counter -= 3) > 2);
        if ((int)counter > 0)
        {
          pOut_buf_cur[0] = pSrc[0];
          if ((int)counter > 1)
            pOut_buf_cur[1] = pSrc[1];
          pOut_buf_cur += counter;
        }
      }
    }
  } while (!(r->m_final & 1));
  if (decomp_flags & TINFL_FLAG_PARSE_ZLIB_HEADER)
  {
    TINFL_SKIP_BITS(32, num_bits & 7); for (counter = 0; counter < 4; ++counter) { mz_uint s; if (num_bits) TINFL_GET_BITS(41, s, 8); else TINFL_GET_BYTE(42, s); r->m_z_adler32 = (r->m_z_adler32 << 8) | s; }
  }
  TINFL_CR_RETURN_FOREVER(34, TINFL_STATUS_DONE);
  TINFL_CR_FINISH

common_exit:
  r->m_num_bits = num_bits; r->m_bit_buf = bit_buf; r->m_dist = dist; r->m_counter = counter; r->m_num_extra = num_extra; r->m_dist_from_out_buf_start = dist_from_out_buf_start;
  *pIn_buf_size = pIn_buf_cur - pIn_buf_next; *pOut_buf_size = pOut_buf_cur - pOut_buf_next;
  //if ((decomp_flags & (TINFL_FLAG_PARSE_ZLIB_HEADER | TINFL_FLAG_COMPUTE_ADLER32)) && (status >= 0))
  if ((decomp_flags & TINFL_FLAG_COMPUTE_ADLER32) && (status >= 0))
  {
    const mz_uint8 *ptr = pOut_buf_next; size_t buf_len = *pOut_buf_size;
    mz_uint32 i, s1 = r->m_check_adler32 & 0xffff, s2 = r->m_check_adler32 >> 16; size_t block_len = buf_len % 5552;
    while (buf_len)
    {
      for (i = 0; i + 7 < block_len; i += 8, ptr += 8)
      {
        s1 += ptr[0], s2 += s1; s1 += ptr[1], s2 += s1; s1 += ptr[2], s2 += s1; s1 += ptr[3], s2 += s1;
        s1 += ptr[4], s2 += s1; s1 += ptr[5], s2 += s1; s1 += ptr[6], s2 += s1; s1 += ptr[7], s2 += s1;
      }
      for ( ; i < block_len; ++i) s1 += *ptr++, s2 += s1;
      s1 %= 65521U, s2 %= 65521U; buf_len -= block_len; block_len = 5552;
    }
    r->m_check_adler32 = (s2 << 16) + s1; 
    if ((status == TINFL_STATUS_DONE) && (decomp_flags & TINFL_FLAG_PARSE_ZLIB_HEADER) && (r->m_check_adler32 != r->m_z_adler32)) 
        status = TINFL_STATUS_ADLER32_MISMATCH;
  }
  return status;
}